

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  internal *piVar6;
  TestResult *result;
  TestInfo *pTVar7;
  size_t width;
  size_t width_00;
  TimeInMillis ms;
  TimeInMillis ms_00;
  size_t width_01;
  string local_248;
  int local_228;
  byte local_221;
  int i;
  bool comma;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  undefined1 local_60 [8];
  string kIndent;
  undefined1 local_38 [8];
  string kTestsuite;
  TestSuite *test_suite_local;
  ostream *stream_local;
  
  kTestsuite.field_2._8_8_ = test_suite;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"testsuite",(allocator<char> *)(kIndent.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(kIndent.field_2._M_local_buf + 0xf));
  Indent_abi_cxx11_((string *)local_60,(internal *)0x6,width);
  Indent_abi_cxx11_(&local_80,(internal *)0x4,width_00);
  poVar4 = std::operator<<(stream,(string *)&local_80);
  std::operator<<(poVar4,"{\n");
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"name",&local_a1);
  pcVar5 = TestSuite::name((TestSuite *)kTestsuite.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar5,&local_c9);
  OutputJsonKey(stream,(string *)local_38,&local_a0,&local_c8,(string *)local_60,true);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"tests",&local_f1);
  iVar2 = TestSuite::reportable_test_count((TestSuite *)kTestsuite.field_2._8_8_);
  OutputJsonKey(stream,(string *)local_38,&local_f0,iVar2,(string *)local_60,true);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"failures",&local_119);
    iVar2 = TestSuite::failed_test_count((TestSuite *)kTestsuite.field_2._8_8_);
    OutputJsonKey(stream,(string *)local_38,&local_118,iVar2,(string *)local_60,true);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"disabled",&local_141);
    iVar2 = TestSuite::reportable_disabled_test_count((TestSuite *)kTestsuite.field_2._8_8_);
    OutputJsonKey(stream,(string *)local_38,&local_140,iVar2,(string *)local_60,true);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"errors",&local_169);
    OutputJsonKey(stream,(string *)local_38,&local_168,0,(string *)local_60,true);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"timestamp",&local_191);
    piVar6 = (internal *)TestSuite::start_timestamp((TestSuite *)kTestsuite.field_2._8_8_);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(&local_1b8,piVar6,ms);
    OutputJsonKey(stream,(string *)local_38,&local_190,&local_1b8,(string *)local_60,true);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"time",&local_1d9);
    piVar6 = (internal *)TestSuite::elapsed_time((TestSuite *)kTestsuite.field_2._8_8_);
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_200,piVar6,ms_00);
    OutputJsonKey(stream,(string *)local_38,&local_1d8,&local_200,(string *)local_60,false);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    result = TestSuite::ad_hoc_test_result((TestSuite *)kTestsuite.field_2._8_8_);
    TestPropertiesAsJson((string *)&i,result,(string *)local_60);
    poVar4 = std::operator<<(stream,(string *)&i);
    std::operator<<(poVar4,",\n");
    std::__cxx11::string::~string((string *)&i);
  }
  poVar4 = std::operator<<(stream,(string *)local_60);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,(string *)local_38);
  std::operator<<(poVar4,"\": [\n");
  local_221 = 0;
  for (local_228 = 0; iVar2 = local_228,
      iVar3 = TestSuite::total_test_count((TestSuite *)kTestsuite.field_2._8_8_), iVar2 < iVar3;
      local_228 = local_228 + 1) {
    pTVar7 = TestSuite::GetTestInfo((TestSuite *)kTestsuite.field_2._8_8_,local_228);
    bVar1 = TestInfo::is_reportable(pTVar7);
    if (bVar1) {
      if ((local_221 & 1) == 0) {
        local_221 = 1;
      }
      else {
        std::operator<<(stream,",\n");
      }
      pcVar5 = TestSuite::name((TestSuite *)kTestsuite.field_2._8_8_);
      pTVar7 = TestSuite::GetTestInfo((TestSuite *)kTestsuite.field_2._8_8_,local_228);
      OutputJsonTestInfo(stream,pcVar5,pTVar7);
    }
  }
  poVar4 = std::operator<<(stream,"\n");
  poVar4 = std::operator<<(poVar4,(string *)local_60);
  poVar4 = std::operator<<(poVar4,"]\n");
  Indent_abi_cxx11_(&local_248,(internal *)0x4,width_01);
  poVar4 = std::operator<<(poVar4,(string *)&local_248);
  std::operator<<(poVar4,"}");
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestSuite(
    std::ostream* stream, const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  const std::string kIndent = Indent(6);

  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_suite.name(), kIndent);
  OutputJsonKey(stream, kTestsuite, "tests", test_suite.reportable_test_count(),
                kIndent);
  if (!GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "failures",
                  test_suite.failed_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "disabled",
                  test_suite.reportable_disabled_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "errors", 0, kIndent);
    OutputJsonKey(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsRFC3339(test_suite.start_timestamp()),
        kIndent);
    OutputJsonKey(stream, kTestsuite, "time",
                  FormatTimeInMillisAsDuration(test_suite.elapsed_time()),
                  kIndent, false);
    *stream << TestPropertiesAsJson(test_suite.ad_hoc_test_result(), kIndent)
            << ",\n";
  }

  *stream << kIndent << "\"" << kTestsuite << "\": [\n";

  bool comma = false;
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable()) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      OutputJsonTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
    }
  }
  *stream << "\n" << kIndent << "]\n" << Indent(4) << "}";
}